

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecMan.c
# Opt level: O1

Cec_ManPat_t * Cec_ManPatStart(void)

{
  Cec_ManPat_t *pCVar1;
  Vec_Str_t *pVVar2;
  char *pcVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  
  pCVar1 = (Cec_ManPat_t *)calloc(1,0x78);
  pVVar2 = (Vec_Str_t *)malloc(0x10);
  pVVar2->nCap = 0x100000;
  pVVar2->nSize = 0;
  pcVar3 = (char *)malloc(0x100000);
  pVVar2->pArray = pcVar3;
  pCVar1->vStorage = pVVar2;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 1000;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(4000);
  pVVar4->pArray = piVar5;
  pCVar1->vPattern1 = pVVar4;
  pVVar4 = (Vec_Int_t *)malloc(0x10);
  pVVar4->nCap = 1000;
  pVVar4->nSize = 0;
  piVar5 = (int *)malloc(4000);
  pVVar4->pArray = piVar5;
  pCVar1->vPattern2 = pVVar4;
  return pCVar1;
}

Assistant:

Cec_ManPat_t * Cec_ManPatStart()  
{ 
    Cec_ManPat_t * p;
    p = ABC_CALLOC( Cec_ManPat_t, 1 );
    p->vStorage  = Vec_StrAlloc( 1<<20 );
    p->vPattern1 = Vec_IntAlloc( 1000 );
    p->vPattern2 = Vec_IntAlloc( 1000 );
    return p;
}